

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O3

Vec_Int_t * Abc_NamComputeIdMap(Abc_Nam_t *p1,Abc_Nam_t *p2)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  uVar1 = (p1->vInt2Handle).nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  if (p1 == p2) {
    pVVar4->nCap = uVar3;
    if (uVar3 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar3 << 2);
    }
    pVVar4->pArray = piVar5;
    pVVar4->nSize = uVar1;
    auVar2 = _DAT_008403e0;
    if (0 < (int)uVar1) {
      lVar10 = (ulong)uVar1 - 1;
      auVar8._8_4_ = (int)lVar10;
      auVar8._0_8_ = lVar10;
      auVar8._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar7 = 0;
      auVar8 = auVar8 ^ _DAT_008403e0;
      auVar9 = _DAT_008403d0;
      do {
        auVar11 = auVar9 ^ auVar2;
        if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                    auVar8._4_4_ < auVar11._4_4_) & 1)) {
          piVar5[uVar7] = (int)uVar7;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          piVar5[uVar7 + 1] = (int)uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
      } while ((uVar1 + 1 & 0xfffffffe) != uVar7);
    }
  }
  else {
    pVVar4->nCap = uVar3;
    if (uVar3 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar3 << 2);
    }
    pVVar4->pArray = piVar5;
    pVVar4->nSize = uVar1;
    memset(piVar5,0,(long)(int)uVar1 << 2);
    if (1 < (int)uVar1) {
      uVar7 = 1;
      do {
        piVar6 = Abc_NamStrHashFind(p2,p1->pStore + (p1->vInt2Handle).pArray[uVar7],(char *)0x0);
        if (uVar1 == uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar5[uVar7] = *piVar6;
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)(p1->vInt2Handle).nSize);
    }
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_NamComputeIdMap( Abc_Nam_t * p1, Abc_Nam_t * p2 )
{
    Vec_Int_t * vMap;
    char * pThis;
    int * piPlace, iHandle1, i;
    if ( p1 == p2 )
        return Vec_IntStartNatural( Abc_NamObjNumMax(p1) );
    vMap = Vec_IntStart( Abc_NamObjNumMax(p1) );
    Vec_IntForEachEntryStart( &p1->vInt2Handle, iHandle1, i, 1 )
    {
        pThis = Abc_NamHandleToStr( p1, iHandle1 );
        piPlace = Abc_NamStrHashFind( p2, pThis, NULL );
        Vec_IntWriteEntry( vMap, i, *piPlace );
//        Abc_Print( 1, "%d->%d  ", i, *piPlace );
    }
    return vMap;
}